

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O0

string * __thiscall
cpptrace::microfmt::detail::to_string_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,uint64_t value,format_options *options)

{
  format_options *options_local;
  uint64_t value_local;
  
  switch(*(undefined1 *)(value + 0x10)) {
  case 0x48:
    to_string<4,15>(__return_storage_ptr__,this,0x338cc3,
                    (char *)&switchD_00269c47::switchdataD_0033c344);
    break;
  default:
    std::__cxx11::to_string(__return_storage_ptr__,(unsigned_long)this);
    break;
  case 0x62:
    to_string<1,1>(__return_storage_ptr__,this,0x338cd4,
                   (char *)&switchD_00269c47::switchdataD_0033c344);
    break;
  case 0x68:
    to_string<4,15>(__return_storage_ptr__,this,0x338cd4,
                    (char *)&switchD_00269c47::switchdataD_0033c344);
    break;
  case 0x6f:
    to_string<3,7>(__return_storage_ptr__,this,0x338cd4,
                   (char *)&switchD_00269c47::switchdataD_0033c344);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(std::uint64_t value, const format_options& options) {
            switch(options.base) {
                case 'H': return to_string<4, 0xf>(value, "0123456789ABCDEF");
                case 'h': return to_string<4, 0xf>(value);
                case 'o': return to_string<3, 0x7>(value);
                case 'b': return to_string<1, 0x1>(value);
                default: return std::to_string(value); // failure: decimal
            }
        }